

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O1

void __thiscall
HashtableAllTest_Equals_Test<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Equals_Test<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *this_00;
  undefined8 *puVar1;
  size_type sVar2;
  bool bVar3;
  int iVar4;
  pointer *__ptr;
  int i;
  uint index;
  char *in_R9;
  AssertionResult gtest_ar__5;
  AssertionResult gtest_ar_;
  Alloc<int,_unsigned_long,_18446744073709551615UL> alloc;
  TypeParam ht3;
  hasher hasher;
  TypeParam ht1;
  TypeParam ht2;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_208;
  AssertHelper local_200;
  undefined8 *local_1f8;
  AssertHelper local_1f0;
  string local_1e8;
  allocator_type local_1c8;
  undefined1 local_1b8 [8];
  int *local_1b0;
  char local_1a8 [104];
  pointer local_140;
  hasher local_134;
  HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_128;
  undefined1 local_a8 [8];
  dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_a0;
  
  local_1b8 = (undefined1  [8])0x0;
  local_1b0 = (int *)((ulong)local_1b0 & 0xffffffff00000000);
  local_1e8._M_dataplus._M_p = (pointer)0x0;
  local_1e8._M_string_length = local_1e8._M_string_length & 0xffffffff00000000;
  local_a8 = (undefined1  [8])((ulong)local_a8 & 0xffffffff00000000);
  local_a0.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher._0_8_ =
       (int *)0x0;
  google::
  HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashSet
            (&local_128,0,(hasher *)local_1b8,(key_equal *)&local_1e8,(allocator_type *)local_a8);
  local_1e8._M_dataplus._M_p = (pointer)0x0;
  local_1e8._M_string_length = local_1e8._M_string_length & 0xffffffff00000000;
  local_1c8._0_8_ = (long *)0x0;
  local_1c8.count_ = (int *)((ulong)local_1c8.count_._4_4_ << 0x20);
  local_1b8 = (undefined1  [8])((ulong)local_1b8 & 0xffffffff00000000);
  local_1b0 = (int *)0x0;
  google::
  HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)local_a8,0,(hasher *)&local_1e8,(key_equal *)&local_1c8,(allocator_type *)local_1b8)
  ;
  this_00 = &local_128.
             super_BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_;
  bVar3 = google::
          dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(&this_00->rep,&local_a0);
  local_1e8._M_dataplus._M_p._0_1_ = bVar3;
  local_1e8._M_string_length = 0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_1c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1b8,(internal *)&local_1e8,(AssertionResult *)"ht1 == ht2","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x42e,(char *)local_1b8);
    testing::internal::AssertHelper::operator=(&local_200,(Message *)&local_1c8);
    testing::internal::AssertHelper::~AssertHelper(&local_200);
    if (local_1b8 != (undefined1  [8])local_1a8) {
      operator_delete((void *)local_1b8);
    }
    if ((long *)local_1c8._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_1c8._0_8_ + 8))();
    }
  }
  sVar2 = local_1e8._M_string_length;
  if ((undefined8 *)local_1e8._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_1e8._M_string_length !=
        (undefined8 *)(local_1e8._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_1e8._M_string_length);
    }
    operator_delete((void *)sVar2);
  }
  bVar3 = google::
          dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(&this_00->rep,&local_a0);
  local_1e8._M_dataplus._M_p._0_1_ = bVar3;
  local_1e8._M_string_length = 0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_1c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1b8,(internal *)&local_1e8,(AssertionResult *)"ht1 != ht2","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x42f,(char *)local_1b8);
    testing::internal::AssertHelper::operator=(&local_200,(Message *)&local_1c8);
    testing::internal::AssertHelper::~AssertHelper(&local_200);
    if (local_1b8 != (undefined1  [8])local_1a8) {
      operator_delete((void *)local_1b8);
    }
    if ((long *)local_1c8._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_1c8._0_8_ + 8))();
    }
  }
  sVar2 = local_1e8._M_string_length;
  if ((undefined8 *)local_1e8._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_1e8._M_string_length !=
        (undefined8 *)(local_1e8._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_1e8._M_string_length);
    }
    operator_delete((void *)sVar2);
  }
  iVar4 = UniqueObjectHelper<int>(1);
  google::
  dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted(&this_00->rep);
  local_128.
  super_BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  .ht_.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.use_deleted_ = true;
  local_128.
  super_BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  .ht_.rep.key_info.delkey = iVar4;
  bVar3 = google::
          dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(&this_00->rep,&local_a0);
  local_1e8._M_dataplus._M_p._0_1_ = bVar3;
  local_1e8._M_string_length = 0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_1c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1b8,(internal *)&local_1e8,(AssertionResult *)"ht1 == ht2","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x432,(char *)local_1b8);
    testing::internal::AssertHelper::operator=(&local_200,(Message *)&local_1c8);
    testing::internal::AssertHelper::~AssertHelper(&local_200);
    if (local_1b8 != (undefined1  [8])local_1a8) {
      operator_delete((void *)local_1b8);
    }
    if ((long *)local_1c8._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_1c8._0_8_ + 8))();
    }
  }
  sVar2 = local_1e8._M_string_length;
  if ((undefined8 *)local_1e8._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_1e8._M_string_length !=
        (undefined8 *)(local_1e8._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_1e8._M_string_length);
    }
    operator_delete((void *)sVar2);
  }
  bVar3 = google::
          dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(&this_00->rep,&local_a0);
  local_1e8._M_dataplus._M_p._0_1_ = bVar3;
  local_1e8._M_string_length = 0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_1c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1b8,(internal *)&local_1e8,(AssertionResult *)"ht1 != ht2","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x433,(char *)local_1b8);
    testing::internal::AssertHelper::operator=(&local_200,(Message *)&local_1c8);
    testing::internal::AssertHelper::~AssertHelper(&local_200);
    if (local_1b8 != (undefined1  [8])local_1a8) {
      operator_delete((void *)local_1b8);
    }
    if ((long *)local_1c8._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_1c8._0_8_ + 8))();
    }
  }
  sVar2 = local_1e8._M_string_length;
  if ((undefined8 *)local_1e8._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_1e8._M_string_length !=
        (undefined8 *)(local_1e8._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_1e8._M_string_length);
    }
    operator_delete((void *)sVar2);
  }
  google::
  dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::resize(&this_00->rep,2000);
  bVar3 = google::
          dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(&this_00->rep,&local_a0);
  local_1e8._M_dataplus._M_p._0_1_ = bVar3;
  local_1e8._M_string_length = 0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_1c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1b8,(internal *)&local_1e8,(AssertionResult *)"ht1 == ht2","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x435,(char *)local_1b8);
    testing::internal::AssertHelper::operator=(&local_200,(Message *)&local_1c8);
    testing::internal::AssertHelper::~AssertHelper(&local_200);
    if (local_1b8 != (undefined1  [8])local_1a8) {
      operator_delete((void *)local_1b8);
    }
    if ((long *)local_1c8._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_1c8._0_8_ + 8))();
    }
  }
  sVar2 = local_1e8._M_string_length;
  if ((undefined8 *)local_1e8._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_1e8._M_string_length !=
        (undefined8 *)(local_1e8._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_1e8._M_string_length);
    }
    operator_delete((void *)sVar2);
  }
  local_134.id_ = 1;
  local_134.num_hashes_ = 0;
  local_134.num_compares_ = 0;
  local_1c8.id_ = 2;
  local_1c8.count_ = (int *)0x0;
  google::
  HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)local_1b8,5,&local_134,&local_134,&local_1c8);
  bVar3 = google::
          dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(&this_00->rep,
                       (dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                        *)&local_1b0);
  local_200.data_._0_4_ = CONCAT31(local_200.data_._1_3_,bVar3);
  local_1f8 = (undefined8 *)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_208);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1e8,(internal *)&local_200,(AssertionResult *)"ht1 == ht3","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x43b,local_1e8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_1f0,(Message *)&local_208);
    testing::internal::AssertHelper::~AssertHelper(&local_1f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p);
    }
    if (local_208._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_208._M_head_impl + 8))();
    }
  }
  puVar1 = local_1f8;
  if (local_1f8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_1f8 != local_1f8 + 2) {
      operator_delete((undefined8 *)*local_1f8);
    }
    operator_delete(puVar1);
  }
  bVar3 = google::
          dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(&this_00->rep,
                       (dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                        *)&local_1b0);
  local_200.data_._0_4_ = CONCAT31(local_200.data_._1_3_,bVar3);
  local_1f8 = (undefined8 *)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_208);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1e8,(internal *)&local_200,(AssertionResult *)"ht1 != ht3","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x43c,local_1e8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_1f0,(Message *)&local_208);
    testing::internal::AssertHelper::~AssertHelper(&local_1f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p);
    }
    if (local_208._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_208._M_head_impl + 8))();
    }
  }
  puVar1 = local_1f8;
  if (local_1f8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_1f8 != local_1f8 + 2) {
      operator_delete((undefined8 *)*local_1f8);
    }
    operator_delete(puVar1);
  }
  local_200.data_._0_4_ = UniqueObjectHelper<int>(2);
  google::
  dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta(&this_00->rep,1);
  google::
  dense_hashtable<int,int,Hasher,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
  ::insert_noresize<int_const&,int_const&>
            ((pair<google::dense_hashtable_iterator<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
              *)&local_1e8,
             (dense_hashtable<int,int,Hasher,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
              *)this_00,(int *)&local_200,(int *)&local_200);
  bVar3 = google::
          dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(&this_00->rep,&local_a0);
  local_200.data_._0_4_ = CONCAT31(local_200.data_._1_3_,!bVar3);
  local_1f8 = (undefined8 *)0x0;
  if (bVar3) {
    testing::Message::Message((Message *)&local_208);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1e8,(internal *)&local_200,(AssertionResult *)"ht1 != ht2","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x43f,local_1e8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_1f0,(Message *)&local_208);
    testing::internal::AssertHelper::~AssertHelper(&local_1f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p);
    }
    if (local_208._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_208._M_head_impl + 8))();
    }
  }
  puVar1 = local_1f8;
  if (local_1f8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_1f8 != local_1f8 + 2) {
      operator_delete((undefined8 *)*local_1f8);
    }
    operator_delete(puVar1);
  }
  bVar3 = google::
          dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(&this_00->rep,&local_a0);
  local_200.data_._0_4_ = CONCAT31(local_200.data_._1_3_,!bVar3);
  local_1f8 = (undefined8 *)0x0;
  if (bVar3) {
    testing::Message::Message((Message *)&local_208);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1e8,(internal *)&local_200,(AssertionResult *)"ht1 == ht2","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x440,local_1e8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_1f0,(Message *)&local_208);
    testing::internal::AssertHelper::~AssertHelper(&local_1f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p);
    }
    if (local_208._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_208._M_head_impl + 8))();
    }
  }
  puVar1 = local_1f8;
  if (local_1f8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_1f8 != local_1f8 + 2) {
      operator_delete((undefined8 *)*local_1f8);
    }
    operator_delete(puVar1);
  }
  local_200.data_._0_4_ = UniqueObjectHelper<int>(2);
  google::
  dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta(&local_a0,1);
  google::
  dense_hashtable<int,int,Hasher,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
  ::insert_noresize<int_const&,int_const&>
            ((pair<google::dense_hashtable_iterator<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
              *)&local_1e8,
             (dense_hashtable<int,int,Hasher,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
              *)&local_a0,(int *)&local_200,(int *)&local_200);
  bVar3 = google::
          dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(&this_00->rep,&local_a0);
  local_200.data_._0_4_ = CONCAT31(local_200.data_._1_3_,bVar3);
  local_1f8 = (undefined8 *)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_208);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1e8,(internal *)&local_200,(AssertionResult *)"ht1 == ht2","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x443,local_1e8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_1f0,(Message *)&local_208);
    testing::internal::AssertHelper::~AssertHelper(&local_1f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p);
    }
    if (local_208._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_208._M_head_impl + 8))();
    }
  }
  puVar1 = local_1f8;
  if (local_1f8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_1f8 != local_1f8 + 2) {
      operator_delete((undefined8 *)*local_1f8);
    }
    operator_delete(puVar1);
  }
  iVar4 = 3;
  do {
    local_200.data_._0_4_ = UniqueObjectHelper<int>(iVar4);
    google::
    dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::resize_delta(&this_00->rep,1);
    google::
    dense_hashtable<int,int,Hasher,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
    ::insert_noresize<int_const&,int_const&>
              ((pair<google::dense_hashtable_iterator<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
                *)&local_1e8,
               (dense_hashtable<int,int,Hasher,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                *)this_00,(int *)&local_200,(int *)&local_200);
    iVar4 = iVar4 + 1;
  } while (iVar4 != 0x7d1);
  index = 0x7d1;
  do {
    index = index - 1;
    local_200.data_._0_4_ = UniqueObjectHelper<int>(index);
    google::
    dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::resize_delta(&local_a0,1);
    google::
    dense_hashtable<int,int,Hasher,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
    ::insert_noresize<int_const&,int_const&>
              ((pair<google::dense_hashtable_iterator<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
                *)&local_1e8,
               (dense_hashtable<int,int,Hasher,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                *)&local_a0,(int *)&local_200,(int *)&local_200);
  } while (3 < index);
  bVar3 = google::
          dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::operator==(&this_00->rep,&local_a0);
  local_200.data_._0_4_ = CONCAT31(local_200.data_._1_3_,bVar3);
  local_1f8 = (undefined8 *)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_208);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1e8,(internal *)&local_200,(AssertionResult *)"ht1 == ht2","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,1099,local_1e8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_1f0,(Message *)&local_208);
    testing::internal::AssertHelper::~AssertHelper(&local_1f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p);
    }
    if (local_208._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_208._M_head_impl + 8))();
    }
  }
  puVar1 = local_1f8;
  if (local_1f8 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_1f8 != local_1f8 + 2) {
      operator_delete((undefined8 *)*local_1f8);
    }
    operator_delete(puVar1);
  }
  local_1b8 = (undefined1  [8])&PTR__BaseHashtableInterface_00c23618;
  if (local_140 != (pointer)0x0) {
    free(local_140);
  }
  local_a8 = (undefined1  [8])&PTR__BaseHashtableInterface_00c23618;
  if (local_a0.table != (pointer)0x0) {
    free(local_a0.table);
  }
  local_128.
  super_BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ._vptr_BaseHashtableInterface = (_func_int **)&PTR__BaseHashtableInterface_00c23618;
  if (local_128.
      super_BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      .ht_.rep.table != (pointer)0x0) {
    free(local_128.
         super_BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         .ht_.rep.table);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Equals) {
  // The real test here is whether two hashtables are equal if they
  // have the same items but in a different order.
  TypeParam ht1;
  TypeParam ht2;

  EXPECT_TRUE(ht1 == ht1);
  EXPECT_FALSE(ht1 != ht1);
  EXPECT_TRUE(ht1 == ht2);
  EXPECT_FALSE(ht1 != ht2);
  ht1.set_deleted_key(this->UniqueKey(1));
  // Only the contents affect equality, not things like deleted-key.
  EXPECT_TRUE(ht1 == ht2);
  EXPECT_FALSE(ht1 != ht2);
  ht1.resize(2000);
  EXPECT_TRUE(ht1 == ht2);

  // The choice of allocator/etc doesn't matter either.
  typename TypeParam::hasher hasher(1);
  Alloc<typename TypeParam::key_type> alloc(2, NULL);
  TypeParam ht3(5, hasher, hasher, alloc);
  EXPECT_TRUE(ht1 == ht3);
  EXPECT_FALSE(ht1 != ht3);

  ht1.insert(this->UniqueObject(2));
  EXPECT_TRUE(ht1 != ht2);
  EXPECT_FALSE(ht1 == ht2);  // this should hold as well!

  ht2.insert(this->UniqueObject(2));
  EXPECT_TRUE(ht1 == ht2);

  for (int i = 3; i <= 2000; i++) {
    ht1.insert(this->UniqueObject(i));
  }
  for (int i = 2000; i >= 3; i--) {
    ht2.insert(this->UniqueObject(i));
  }
  EXPECT_TRUE(ht1 == ht2);
}